

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O2

bool booster::regex_match<booster::regex>(char *begin,char *end,cmatch *m,regex *r,int flags)

{
  pointer ppVar1;
  pointer ppVar2;
  pointer ppVar3;
  char cVar4;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar4 = booster::regex::match((char *)r,begin,(vector *)end,(int)&local_38);
  if (cVar4 != '\0') {
    m->begin_ = begin;
    m->end_ = end;
    ppVar1 = (m->offsets_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (m->offsets_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_38._M_impl.super__Vector_impl_data._M_end_of_storage;
    ppVar2 = (m->offsets_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar3 = (m->offsets_).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (m->offsets_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_start = local_38._M_impl.super__Vector_impl_data._M_start;
    (m->offsets_).super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = local_38._M_impl.super__Vector_impl_data._M_finish;
    local_38._M_impl.super__Vector_impl_data._M_start = ppVar2;
    local_38._M_impl.super__Vector_impl_data._M_finish = ppVar3;
    local_38._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar1;
  }
  std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
            (&local_38);
  return (bool)cVar4;
}

Assistant:

bool regex_match(char const *begin,char const *end,cmatch &m, Regex const &r,int flags = 0)
	{
		std::vector<std::pair<int,int> > map;
		bool res = r.match(begin,end,map,flags);
		if(!res) return false;
		m.assign(begin,end,map);
		return true;
	}